

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstruct<float>_>::TPZDohrPrecond
          (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *this,
          TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *cp)

{
  undefined8 uVar1;
  long in_RSI;
  TPZMatrix<float> *in_RDI;
  list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
  *unaff_retaddr;
  TPZAutoPointer<TPZDohrAssembly<float>_> *in_stack_ffffffffffffffb8;
  TPZMatrix<float> *in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<float> *__x;
  
  __x = in_RDI;
  TPZMatrix<float>::TPZMatrix(in_RDI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  (in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZDohrPrecond_025a4148;
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
  ::list(unaff_retaddr,
         (list<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
          *)__x);
  in_RDI[1].super_TPZBaseMatrix.fDecomposed = '\0';
  in_RDI[1].super_TPZBaseMatrix.fDefPositive = '\0';
  *(undefined6 *)&in_RDI[1].super_TPZBaseMatrix.field_0x1a = 0;
  in_RDI[2].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = *(_func_int ***)(in_RSI + 0x40);
  *(undefined4 *)&in_RDI[2].super_TPZBaseMatrix.fRow = *(undefined4 *)(in_RSI + 0x48);
  TPZAutoPointer<TPZDohrAssembly<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembly<float>_> *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  if (*(long *)(in_RSI + 0x38) != 0) {
    uVar1 = (**(code **)(**(long **)(in_RSI + 0x38) + 0x48))();
    in_RDI[1].super_TPZBaseMatrix.fDecomposed = (char)uVar1;
    in_RDI[1].super_TPZBaseMatrix.fDefPositive = (char)((ulong)uVar1 >> 8);
    *(int6 *)&in_RDI[1].super_TPZBaseMatrix.field_0x1a = (int6)((ulong)uVar1 >> 0x10);
  }
  return;
}

Assistant:

TPZDohrPrecond<TVar, TSubStruct>::TPZDohrPrecond(const TPZDohrPrecond<TVar, TSubStruct> &cp) : TPZMatrix<TVar>(cp), fGlobal(cp.fGlobal), fCoarse(0),
fNumCoarse(cp.fNumCoarse), fNumThreads(cp.fNumThreads), fAssemble(cp.fAssemble)
{
	if (cp.fCoarse) {
		fCoarse = (TPZStepSolver<TVar> *) cp.fCoarse->Clone();
	}
}